

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int testnext(LexState *ls,int c)

{
  int in_ESI;
  long in_RDI;
  bool bVar1;
  uint local_4;
  
  bVar1 = *(int *)(in_RDI + 0x10) == in_ESI;
  if (bVar1) {
    luaX_next((LexState *)0x114805);
  }
  local_4 = (uint)bVar1;
  return local_4;
}

Assistant:

static int testnext(LexState*ls,int c){
if(ls->t.token==c){
luaX_next(ls);
return 1;
}
else return 0;
}